

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Mul_f32(w3Interp *this)

{
  float *pfVar1;
  float fVar2;
  float a;
  w3Interp *this_local;
  
  fVar2 = w3Stack::pop_f32(&this->super_w3Stack);
  pfVar1 = w3Stack::f32(&this->super_w3Stack);
  *pfVar1 = fVar2 * *pfVar1;
  return;
}

Assistant:

INTERP (Mul_f32)
{
    const float a = pop_f32 ();
    f32 () *= a;
}